

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv_udp_open(uv_udp_t *handle,uv_os_sock_t sock)

{
  int iVar1;
  
  if ((handle->io_watcher).fd != -1) {
    return -0x10;
  }
  iVar1 = uv__nonblock_ioctl(sock,1);
  if (iVar1 == 0) {
    iVar1 = uv__set_reuse(sock);
    if (iVar1 == 0) {
      (handle->io_watcher).fd = sock;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int uv_udp_open(uv_udp_t* handle, uv_os_sock_t sock) {
  int err;

  /* Check for already active socket. */
  if (handle->io_watcher.fd != -1)
    return -EBUSY;

  err = uv__nonblock(sock, 1);
  if (err)
    return err;

  err = uv__set_reuse(sock);
  if (err)
    return err;

  handle->io_watcher.fd = sock;
  return 0;
}